

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<24U,_unsigned_char,_void,_false> *x)

{
  char fill_char_str;
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  unsigned_fast_type field_width_00;
  iterator pvVar2;
  pointer pvVar3;
  ostream *poVar4;
  bool show_pos_00;
  bool show_base_00;
  bool is_uppercase_00;
  string local_238 [37];
  value_type local_213;
  allocator_type local_212;
  value_type local_211;
  undefined1 local_210 [8];
  string_storage_hex_type str_result_2;
  undefined1 local_1f0 [8];
  string_storage_dec_type str_result_1;
  undefined1 local_1d0 [8];
  string_storage_oct_type str_result;
  char fill_char_out;
  unsigned_fast_type field_width;
  uint_fast8_t base_rep;
  bool is_uppercase;
  bool show_base;
  bool show_pos;
  fmtflags my_flags;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  uintwide_t<24U,_unsigned_char,_void,_false> *x_local;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&base_rep);
  __a = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  _Var1 = std::operator&(__a,_S_showpos);
  show_pos_00 = _Var1 == _S_showpos;
  _Var1 = std::operator&(__a,_S_showbase);
  show_base_00 = _Var1 == _S_showbase;
  _Var1 = std::operator&(__a,_S_uppercase);
  is_uppercase_00 = _Var1 == _S_uppercase;
  _Var1 = std::operator&(__a,_S_oct);
  if (_Var1 == _S_oct) {
    field_width._0_1_ = '\b';
  }
  else {
    _Var1 = std::operator&(__a,_S_hex);
    if (_Var1 == _S_hex) {
      field_width._0_1_ = '\x10';
    }
    else {
      field_width._0_1_ = '\n';
    }
  }
  field_width_00 = std::ios_base::width((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  fill_char_str = std::ios::fill();
  if ((char)field_width == '\b') {
    str_result_1.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
    _7_1_ = 0;
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_21854U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_21854U,_std::allocator<unsigned_int>_> *)local_1d0,0x555e,
               (value_type *)
               ((long)&str_result_1.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 7),
               (allocator_type *)
               ((long)&str_result_1.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&str_result_1.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 6));
    str_result_1.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
    _5_1_ = 0;
    util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::fill
              ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)local_1d0,
               (value_type *)
               ((long)&str_result_1.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 5));
    pvVar2 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::begin
                       ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                        local_1d0);
    uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false>::wr_string<char*>
              ((uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false> *)x,pvVar2,'\b',
               show_base_00,show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pvVar3 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                       ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                        local_1d0);
    std::operator<<((ostream *)&base_rep,pvVar3);
    detail::fixed_dynamic_array<char,_21854U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_21854U,_std::allocator<unsigned_int>_> *)local_1d0);
  }
  else if ((char)field_width == '\n') {
    str_result_2.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
    _7_1_ = 0;
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_19736U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_19736U,_std::allocator<unsigned_int>_> *)local_1f0,0x4d18,
               (value_type *)
               ((long)&str_result_2.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 7),
               (allocator_type *)
               ((long)&str_result_2.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&str_result_2.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 6));
    str_result_2.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
    _5_1_ = 0;
    util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::fill
              ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)local_1f0,
               (value_type *)
               ((long)&str_result_2.
                       super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                       elems + 5));
    pvVar2 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::begin
                       ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                        local_1f0);
    uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false>::wr_string<char*>
              ((uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false> *)x,pvVar2,'\n',
               show_base_00,show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pvVar3 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                       ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                        local_1f0);
    std::operator<<((ostream *)&base_rep,pvVar3);
    detail::fixed_dynamic_array<char,_19736U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_19736U,_std::allocator<unsigned_int>_> *)local_1f0);
  }
  else if ((char)field_width == '\x10') {
    local_211 = '\0';
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_16392U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_16392U,_std::allocator<unsigned_int>_> *)local_210,0x4008,
               &local_211,&local_212);
    std::allocator<char>::~allocator(&local_212);
    local_213 = '\0';
    util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::fill
              ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)local_210,
               &local_213);
    pvVar2 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::begin
                       ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                        local_210);
    uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false>::wr_string<char*>
              ((uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false> *)x,pvVar2,'\x10'
               ,show_base_00,show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pvVar3 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                       ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                        local_210);
    std::operator<<((ostream *)&base_rep,pvVar3);
    detail::fixed_dynamic_array<char,_16392U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_16392U,_std::allocator<unsigned_int>_> *)local_210);
  }
  std::__cxx11::ostringstream::str();
  poVar4 = std::operator<<(out,local_238);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&base_rep);
  return poVar4;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }